

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O2

void __thiscall ddd::DictionarySGL<false,_true>::DictionarySGL(DictionarySGL<false,_true> *this)

{
  __uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  __p;
  tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  in_RAX;
  __uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  local_18;
  
  (this->super_Dictionary)._vptr_Dictionary = (_func_int **)&PTR__DictionarySGL_001477d8;
  (this->trie_)._M_t.
  super___uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl =
       (DaTrie<false,_true,_false> *)0x0;
  this->num_keys_ = 0;
  local_18._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl =
       (tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
        )(tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
          )in_RAX.
           super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl;
  make_unique<ddd::DaTrie<false,true,false>>();
  __p._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
       .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl =
       (tuple<ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
        )(_Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
           *)&this->trie_,
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                   .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl);
  std::
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  ::~unique_ptr((unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                 *)&local_18);
  return;
}

Assistant:

DictionarySGL() {
    trie_ = make_unique<TrieType>();
  }